

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,char *fromFile,char *toFile,MatchProperties *match_properties)

{
  char *pcVar1;
  cmCommand *pcVar2;
  bool bVar3;
  size_t sVar4;
  mode_t perm;
  mode_t permissions;
  undefined1 auStack_1d8 [11];
  allocator local_1cd;
  mode_t local_1cc;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->Always == true) {
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,1);
  }
  else {
    bVar3 = cmFileTimeComparison::FileTimesDiffer(&this->FileTimes,fromFile,toFile);
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,(ulong)bVar3);
    if (!bVar3) goto LAB_00290e94;
  }
  std::__cxx11::string::string((string *)local_1a8,fromFile,(allocator *)&local_1cc);
  std::__cxx11::string::string((string *)&local_1c8,toFile,&local_1cd);
  bVar3 = cmsys::SystemTools::CopyAFile((string *)local_1a8,&local_1c8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
  }
  if (bVar3) {
    if (this->Always == false) {
      local_1cc = 0;
      bVar3 = cmsys::SystemTools::GetPermissions(toFile,&local_1cc);
      if (bVar3) {
        cmsys::SystemTools::SetPermissions(toFile,local_1cc | 0x80,false);
      }
      bVar3 = cmSystemTools::CopyFileTime(fromFile,toFile);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        pcVar1 = this->Name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)auStack_1d8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                          0x30);
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," cannot set modification time on \"",0x22);
        if (toFile == (char *)0x0) {
          std::ios::clear((int)auStack_1d8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                          0x30);
        }
        else {
          sVar4 = strlen(toFile);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
        pcVar2 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar2,&local_1c8);
        goto LAB_002910c2;
      }
    }
LAB_00290e94:
    local_1a8._0_4_ = match_properties->Permissions;
    if (local_1a8._0_4_ == 0) {
      local_1a8._0_4_ = this->FilePermissions;
    }
    if (local_1a8._0_4_ == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,(mode_t *)local_1a8);
    }
    bVar3 = SetPermissions(this,toFile,local_1a8._0_4_);
    return bVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = this->Name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 +
                    (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," cannot copy file \"",0x13);
  if (fromFile == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 +
                    (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(fromFile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fromFile,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\" to \"",6);
  if (toFile == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 +
                    (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(toFile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
  pcVar2 = &this->FileCommand->super_cmCommand;
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(pcVar2,&local_1c8);
LAB_002910c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmFileCopier::InstallFile(const char* fromFile, const char* toFile,
                               MatchProperties const& match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if(!this->Always)
    {
    // If both files exist with the same time do not copy.
    if(!this->FileTimes.FileTimesDiffer(fromFile, toFile))
      {
      copy = false;
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if(copy && !cmSystemTools::CopyAFile(fromFile, toFile, true))
    {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile
      << "\" to \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Set the file modification time of the destination file.
  if(copy && !this->Always)
    {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if(cmSystemTools::GetPermissions(toFile, perm))
      {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
      }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile))
      {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \""
        << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  // Set permissions of the destination file.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->FilePermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
    }
  return this->SetPermissions(toFile, permissions);
}